

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::handle_ext_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  bool bVar1;
  msg_type mVar2;
  int iVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  element_type *peVar7;
  element_type *peVar8;
  undefined8 uVar9;
  __shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  raft_server *in_RDI;
  msg_type in_stack_0000001c;
  rpc_exception *in_stack_000000b8;
  raft_server *in_stack_000000c0;
  resp_msg *in_stack_000000d0;
  raft_server *in_stack_000000d8;
  unique_lock<std::recursive_mutex> guard;
  mutex_type *in_stack_fffffffffffffea8;
  unique_lock<std::recursive_mutex> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  raft_server *in_stack_ffffffffffffff00;
  msg_type in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  resp_msg *in_stack_ffffffffffffff28;
  raft_server *in_stack_ffffffffffffff30;
  string local_b8 [32];
  string local_98 [16];
  resp_msg *in_stack_ffffffffffffff78;
  raft_server *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [32];
  undefined4 local_38;
  __shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_18 = in_RDX;
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_18);
  if (bVar1) {
    std::__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffffeb0);
    handle_ext_resp_err(in_stack_000000c0,in_stack_000000b8);
    local_38 = 1;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x148d33);
      in_stack_ffffffffffffff1c = (**(code **)(*(long *)peVar8 + 0x38))();
      if (4 < in_stack_ffffffffffffff1c) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x148d63);
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148d75);
        in_stack_ffffffffffffff18 = msg_base::get_type(&peVar7->super_msg_base);
        peVar4 = std::__shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>::get(local_18)
        ;
        msg_if_given_abi_cxx11_
                  ((char *)local_58,"type: %d, err %p\n",(ulong)in_stack_ffffffffffffff18,peVar4);
        (**(code **)(*(long *)peVar8 + 0x40))
                  (peVar8,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_resp",0x58b,local_58);
        std::__cxx11::string::~string(local_58);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x148e40);
      iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
      if (4 < iVar3) {
        in_stack_ffffffffffffff00 =
             (raft_server *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x148e70);
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148e82);
        msg_base::get_type(&peVar7->super_msg_base);
        msg_type_to_string_abi_cxx11_(in_stack_0000001c);
        uVar9 = std::__cxx11::string::c_str();
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148ec2);
        in_stack_fffffffffffffefc = msg_base::get_src(&peVar7->super_msg_base);
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148edd);
        bVar1 = resp_msg::get_accepted(peVar7);
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148f06);
        uVar5 = msg_base::get_term(&peVar7->super_msg_base);
        peVar7 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x148f22);
        uVar6 = resp_msg::get_next_idx(peVar7);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,
                   "Receive an extended %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu"
                   ,uVar9,(ulong)in_stack_fffffffffffffefc,(ulong)bVar1,uVar5,uVar6);
        (*in_stack_ffffffffffffff00->_vptr_raft_server[8])
                  (in_stack_ffffffffffffff00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_resp",0x593,local_78);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
      }
    }
    peVar7 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14900a);
    mVar2 = msg_base::get_type(&peVar7->super_msg_base);
    switch(mVar2) {
    case sync_log_response:
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffeb0);
      handle_log_sync_resp(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      break;
    default:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x149114);
        iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
        if (1 < iVar3) {
          in_stack_fffffffffffffeb0 =
               (unique_lock<std::recursive_mutex> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x149144);
          peVar7 = std::
                   __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x149156);
          msg_base::get_type(&peVar7->super_msg_base);
          msg_type_to_string_abi_cxx11_(in_stack_0000001c);
          uVar9 = std::__cxx11::string::c_str();
          msg_if_given_abi_cxx11_
                    ((char *)local_b8,"received an unexpected response message type %s",uVar9);
          (**(code **)((long)&in_stack_fffffffffffffeb0->_M_device[1].super___recursive_mutex_base.
                              _M_mutex + 0x18))
                    (in_stack_fffffffffffffeb0,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_ext_resp",0x5ad,local_b8);
          std::__cxx11::string::~string(local_b8);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
        }
      }
      break;
    case join_cluster_response:
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffeb0);
      handle_join_cluster_resp(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      break;
    case leave_cluster_response:
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffeb0);
      handle_leave_cluster_resp
                (in_RDI,(resp_msg *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      break;
    case install_snapshot_response:
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffeb0);
      handle_install_snapshot_resp_new_member(in_stack_000000d8,in_stack_000000d0);
      break;
    case reconnect_response:
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffeb0);
      handle_reconnect_resp
                (in_stack_ffffffffffffff00,
                 (resp_msg *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    local_38 = 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void raft_server::handle_ext_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        handle_ext_resp_err(*err);
        return;
    }
    p_db("type: %d, err %p\n", (int)resp->get_type(), err.get());

    p_db( "Receive an extended %s message from peer %d with Result=%d, "
          "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    switch (resp->get_type())
    {
    case msg_type::sync_log_response:
        handle_log_sync_resp(*resp);
        break;

    case msg_type::join_cluster_response:
        handle_join_cluster_resp(*resp);
        break;

    case msg_type::leave_cluster_response:
        handle_leave_cluster_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp_new_member(*resp);
        break;

    case msg_type::reconnect_response:
        handle_reconnect_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response message type %s",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}